

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

problem * baryonyx::unpreprocess(problem *__return_storage_ptr__,context *ctx,raw_problem *raw_pb)

{
  double dVar1;
  double dVar2;
  size_t sVar3;
  tuple<double,_baryonyx::show_size_type> *mem;
  undefined1 auVar4 [16];
  undefined1 in_ZMM0 [64];
  undefined4 local_50 [2];
  double local_48;
  string local_40;
  
  auVar4 = in_ZMM0._0_16_;
  sVar3 = memory_consumed(raw_pb);
  auVar4 = vcvtusi2sd_avx512f(auVar4,sVar3);
  local_48 = auVar4._0_8_;
  dVar1 = local_48 * 0.0009765625;
  dVar2 = dVar1 * 0.0009765625;
  if (dVar2 * 0.0009765625 <= 0.5) {
    if (dVar2 <= 0.5) {
      if (dVar1 <= 0.5) {
        local_50[0] = 3;
      }
      else {
        local_50[0] = 2;
        local_48 = dVar1;
      }
    }
    else {
      local_50[0] = 1;
      local_48 = dVar2;
    }
  }
  else {
    local_50[0] = 0;
    local_48 = dVar2 * 0.0009765625;
  }
  to_string_abi_cxx11_(&local_40,(baryonyx *)local_50,mem);
  info<std::__cxx11::string>(ctx,"- Unprepossessing starts (size: {})\n",&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  problem::problem(__return_storage_ptr__,raw_pb);
  return __return_storage_ptr__;
}

Assistant:

problem
unpreprocess(const context& ctx, const raw_problem& raw_pb)
{
    info(ctx,
         "- Unprepossessing starts (size: {})\n",
         to_string(memory_consumed_size(memory_consumed(raw_pb))));

    return problem(raw_pb);
}